

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitTableSet
          (Flow *__return_storage_ptr__,
          ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *this,TableSet *curr)

{
  bool bVar1;
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *pEVar2;
  ExternalInterface *pEVar3;
  Literal *pLVar4;
  Address local_110;
  EvallingModuleRunner *local_108;
  size_t sStack_100;
  uint64_t local_f0;
  uint64_t address;
  undefined8 uStack_e0;
  undefined1 local_d8 [8];
  TableInstanceInfo info;
  Flow value;
  undefined1 local_68 [8];
  Flow index;
  TableSet *curr_local;
  ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *this_local;
  
  index.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar2 = (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)self(this);
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
            ((Flow *)local_68,pEVar2,*(Expression **)(index.breakTo.super_IString.str._M_str + 0x20)
            );
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    pEVar2 = (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)self(this);
    ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
              ((Flow *)&info.name.super_IString.str._M_str,pEVar2,
               *(Expression **)(index.breakTo.super_IString.str._M_str + 0x28));
    bVar1 = Flow::breaking((Flow *)&info.name.super_IString.str._M_str);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&info.name.super_IString.str._M_str);
    }
    else {
      address = (((IString *)(index.breakTo.super_IString.str._M_str + 0x10))->str)._M_len;
      uStack_e0 = *(undefined8 *)(index.breakTo.super_IString.str._M_str + 0x18);
      getTableInstanceInfo
                ((TableInstanceInfo *)local_d8,this,
                 (Name)((IString *)(index.breakTo.super_IString.str._M_str + 0x10))->str);
      Flow::getSingleValue((Flow *)local_68);
      local_f0 = ::wasm::Literal::getUnsigned();
      pEVar3 = TableInstanceInfo::interface((TableInstanceInfo *)local_d8);
      local_108 = info.instance;
      sStack_100 = info.name.super_IString.str._M_len;
      Address::Address(&local_110,local_f0);
      pLVar4 = Flow::getSingleValue((Flow *)&info.name.super_IString.str._M_str);
      (*pEVar3->_vptr_ExternalInterface[0x1c])(pEVar3,local_108,sStack_100,local_110.addr,pLVar4);
      Flow::Flow(__return_storage_ptr__);
    }
    Flow::~Flow((Flow *)&info.name.super_IString.str._M_str);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitTableSet(TableSet* curr) {
    NOTE_ENTER("TableSet");
    Flow index = self()->visit(curr->index);
    if (index.breaking()) {
      return index;
    }
    Flow value = self()->visit(curr->value);
    if (value.breaking()) {
      return value;
    }
    auto info = getTableInstanceInfo(curr->table);
    auto address = index.getSingleValue().getUnsigned();
    info.interface()->tableStore(info.name, address, value.getSingleValue());
    return Flow();
  }